

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::BufferMemoryBarrier
          (DeviceContextVkImpl *this,IBuffer *pBuffer,VkAccessFlags NewAccessFlags)

{
  undefined *puVar1;
  bool bVar2;
  RESOURCE_STATE b;
  RESOURCE_STATE RVar3;
  Char *Message;
  BufferDesc *Args;
  undefined8 uVar4;
  char (*in_RCX) [19];
  char (*in_R8) [38];
  undefined1 local_78 [4];
  RESOURCE_STATE NewState;
  string _msg;
  BufferVkImpl *pBuffVk;
  undefined1 local_40 [8];
  string msg;
  VkAccessFlags NewAccessFlags_local;
  IBuffer *pBuffer_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._12_4_ = NewAccessFlags;
  if (pBuffer == (IBuffer *)0x0) {
    FormatString<char[26],char[19]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xc2897a,
               in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"BufferMemoryBarrier",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xc2f);
    std::__cxx11::string::~string((string *)local_40);
  }
  _msg.field_2._8_8_ = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pBuffer);
  bVar2 = BufferBase<Diligent::EngineVkImplTraits>::IsInKnownState
                    ((BufferBase<Diligent::EngineVkImplTraits> *)_msg.field_2._8_8_);
  if (bVar2) {
    b = VkAccessFlagsToResourceStates(msg.field_2._12_4_);
    RVar3 = BufferBase<Diligent::EngineVkImplTraits>::GetState
                      ((BufferBase<Diligent::EngineVkImplTraits> *)_msg.field_2._8_8_);
    RVar3 = Diligent::operator&(RVar3,b);
    if (RVar3 != b) {
      TransitionBufferState(this,(BufferVkImpl *)_msg.field_2._8_8_,RESOURCE_STATE_UNKNOWN,b,true);
    }
  }
  else {
    Args = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                      *)_msg.field_2._8_8_);
    FormatString<char[53],char_const*,char[38]>
              ((string *)local_78,
               (Diligent *)"Failed to execute buffer memory barrier for buffer \'",
               (char (*) [53])Args,(char **)"\' because the buffer state is unknown",in_R8);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar4 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar4,0);
    }
    std::__cxx11::string::~string((string *)local_78);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::BufferMemoryBarrier(IBuffer* pBuffer, VkAccessFlags NewAccessFlags)
{
    VERIFY_EXPR(pBuffer != nullptr);
    BufferVkImpl* pBuffVk = ClassPtrCast<BufferVkImpl>(pBuffer);
    if (!pBuffVk->IsInKnownState())
    {
        LOG_ERROR_MESSAGE("Failed to execute buffer memory barrier for buffer '", pBuffVk->GetDesc().Name, "' because the buffer state is unknown");
        return;
    }
    RESOURCE_STATE NewState = VkAccessFlagsToResourceStates(NewAccessFlags);
    if ((pBuffVk->GetState() & NewState) != NewState)
    {
        TransitionBufferState(*pBuffVk, RESOURCE_STATE_UNKNOWN, NewState, true);
    }
}